

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg.h
# Opt level: O0

Fill * __thiscall svg::Fill::toString_abi_cxx11_(Fill *this,Layout *layout)

{
  allocator local_241;
  string local_240 [32];
  Color local_220 [2];
  allocator local_1e9;
  string local_1e8 [32];
  svg local_1c8 [32];
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [384];
  Layout *layout_local;
  Fill *this_local;
  
  layout_local = layout;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"fill",&local_1e9);
  Color::toString_abi_cxx11_(local_220,(Layout *)&(layout->dimensions).height);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"",&local_241);
  attribute<std::__cxx11::string>
            (local_1c8,(string *)local_1e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
             (string *)local_240);
  std::operator<<(local_198,(string *)local_1c8);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::__cxx11::string::~string((string *)local_220);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

std::string toString(Layout const & layout) const
        {
            std::stringstream ss;
            ss << attribute("fill", color.toString(layout));
            return ss.str();
        }